

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,undefined8 *params,long params_1,
          long params_2,long params_3,long params_4,long params_5,long params_6,long params_7,
          undefined8 *params_8,long params_9,undefined8 *params_10,long params_11,long params_12,
          long params_13,long params_14,long params_15,long params_16,long params_17,
          undefined8 *params_18,long params_19,undefined8 *params_20,long params_21,long params_22,
          long params_23,long params_24,long params_25,long params_26,long params_27,long params_28,
          long params_29,long params_30,long params_31,undefined8 *params_32,long params_33,
          undefined8 *params_34,long params_35,long params_36,long params_37,long params_38,
          long params_39,long params_40,long params_41,long params_42,long params_43,long params_44,
          long params_45,undefined8 *params_46,long params_47,undefined8 *params_48,
          undefined8 *params_49,long params_50,long params_51,long params_52,long params_53,
          long params_54,long params_55,long params_56,long params_57,long params_58,long params_59,
          long params_60,undefined8 *params_61,long params_62,undefined8 *params_63,long params_64,
          long params_65)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  long in_stack_000001f8;
  long in_stack_00000200;
  long in_stack_00000208;
  long in_stack_00000210;
  long in_stack_00000218;
  long in_stack_00000220;
  long in_stack_00000228;
  long in_stack_00000230;
  long in_stack_00000238;
  undefined8 *in_stack_00000240;
  long in_stack_00000248;
  undefined8 *in_stack_00000250;
  long in_stack_00000258;
  long in_stack_00000260;
  long in_stack_00000268;
  long in_stack_00000270;
  long in_stack_00000278;
  long in_stack_00000280;
  long in_stack_00000288;
  long in_stack_00000290;
  long in_stack_00000298;
  long in_stack_000002a0;
  long in_stack_000002a8;
  undefined8 *in_stack_000002b0;
  long in_stack_000002b8;
  undefined8 *in_stack_000002c0;
  long in_stack_000002c8;
  long in_stack_000002d0;
  long in_stack_000002d8;
  long in_stack_000002e0;
  long in_stack_000002e8;
  long in_stack_000002f0;
  long in_stack_000002f8;
  long in_stack_00000300;
  long in_stack_00000308;
  long in_stack_00000310;
  long in_stack_00000318;
  undefined8 *in_stack_00000320;
  long in_stack_00000328;
  String local_3b8;
  size_t local_398 [107];
  StringTree *local_40;
  undefined8 *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_398[0] = this->size_;
  local_398[1] = *params;
  local_398[2] = *(undefined8 *)(params_1 + 8);
  local_398[3] = *(undefined8 *)(params_2 + 8);
  local_398[4] = *(undefined8 *)(params_3 + 8);
  local_398[5] = *(undefined8 *)(params_4 + 8);
  local_398[6] = *(undefined8 *)(params_5 + 8);
  local_398[7] = *(undefined8 *)(params_6 + 8);
  local_398[8] = *(undefined8 *)(params_7 + 8);
  local_398[9] = *params_8;
  local_398[10] = *(undefined8 *)(params_9 + 8);
  local_398[0xb] = *params_10;
  local_398[0xc] = *(undefined8 *)(params_11 + 8);
  local_398[0xd] = *(undefined8 *)(params_12 + 8);
  local_398[0xe] = *(undefined8 *)(params_13 + 8);
  local_398[0xf] = *(undefined8 *)(params_14 + 8);
  local_398[0x10] = *(undefined8 *)(params_15 + 8);
  local_398[0x11] = *(undefined8 *)(params_16 + 8);
  local_398[0x12] = *(undefined8 *)(params_17 + 8);
  local_398[0x13] = *params_18;
  local_398[0x14] = *(undefined8 *)(params_19 + 8);
  local_398[0x15] = *params_20;
  local_398[0x16] = *(undefined8 *)(params_21 + 8);
  local_398[0x17] = *(long *)(params_22 + 8) - 1;
  if (*(long *)(params_22 + 8) == 0) {
    local_398[0x17] = sVar3;
  }
  local_398[0x18] = *(undefined8 *)(params_23 + 8);
  local_398[0x19] = *(undefined8 *)(params_24 + 8);
  local_398[0x1a] = *(undefined8 *)(params_25 + 8);
  local_398[0x1b] = *(undefined8 *)(params_26 + 8);
  local_398[0x1c] = *(undefined8 *)(params_27 + 8);
  local_398[0x1d] = *(undefined8 *)(params_28 + 8);
  local_398[0x1e] = *(undefined8 *)(params_29 + 8);
  local_398[0x1f] = *(long *)(params_30 + 8) - 1;
  if (*(long *)(params_30 + 8) == 0) {
    local_398[0x1f] = sVar3;
  }
  local_398[0x20] = *(undefined8 *)(params_31 + 8);
  local_398[0x21] = *params_32;
  local_398[0x22] = *(undefined8 *)(params_33 + 8);
  local_398[0x23] = *params_34;
  local_398[0x24] = *(undefined8 *)(params_35 + 8);
  local_398[0x25] = *(long *)(params_36 + 8) - 1;
  if (*(long *)(params_36 + 8) == 0) {
    local_398[0x25] = sVar3;
  }
  local_398[0x26] = *(undefined8 *)(params_37 + 8);
  local_398[0x27] = *(undefined8 *)(params_38 + 8);
  local_398[0x28] = *(undefined8 *)(params_39 + 8);
  local_398[0x29] = *(undefined8 *)(params_40 + 8);
  local_398[0x2a] = *(undefined8 *)(params_41 + 8);
  local_398[0x2b] = *(undefined8 *)(params_42 + 8);
  local_398[0x2c] = *(undefined8 *)(params_43 + 8);
  local_398[0x2d] = *(long *)(params_44 + 8) - 1;
  if (*(long *)(params_44 + 8) == 0) {
    local_398[0x2d] = sVar3;
  }
  local_398[0x2e] = *(undefined8 *)(params_45 + 8);
  local_398[0x2f] = *params_46;
  local_398[0x30] = *(undefined8 *)(params_47 + 8);
  local_398[0x31] = *params_48;
  local_398[0x32] = *params_49;
  local_398[0x33] = *(undefined8 *)(params_50 + 8);
  local_398[0x34] = *(undefined8 *)(params_51 + 8);
  local_398[0x35] = *(undefined8 *)(params_52 + 8);
  local_398[0x36] = *(undefined8 *)(params_53 + 8);
  local_398[0x37] = *(undefined8 *)(params_54 + 8);
  local_398[0x38] = *(long *)(params_55 + 8) - 1;
  if (*(long *)(params_55 + 8) == 0) {
    local_398[0x38] = sVar3;
  }
  local_398[0x39] = *(undefined8 *)(params_56 + 8);
  local_398[0x3a] = *(undefined8 *)(params_57 + 8);
  local_398[0x3b] = *(undefined8 *)(params_58 + 8);
  local_398[0x3c] = *(long *)(params_59 + 8) - 1;
  if (*(long *)(params_59 + 8) == 0) {
    local_398[0x3c] = sVar3;
  }
  local_398[0x3d] = *(undefined8 *)(params_60 + 8);
  local_398[0x3e] = *params_61;
  local_398[0x3f] = *(undefined8 *)(params_62 + 8);
  local_398[0x40] = *params_63;
  local_398[0x41] = *(undefined8 *)(params_64 + 8);
  local_398[0x42] = *(undefined8 *)(params_65 + 8);
  local_398[0x43] = *(undefined8 *)(in_stack_000001f8 + 8);
  local_398[0x44] = *(undefined8 *)(in_stack_00000200 + 8);
  local_398[0x45] = *(undefined8 *)(in_stack_00000208 + 8);
  local_398[0x46] = *(long *)(in_stack_00000210 + 8) - 1;
  if (*(long *)(in_stack_00000210 + 8) == 0) {
    local_398[0x46] = sVar3;
  }
  local_398[0x47] = *(undefined8 *)(in_stack_00000218 + 8);
  local_398[0x48] = *(undefined8 *)(in_stack_00000220 + 8);
  local_398[0x49] = *(undefined8 *)(in_stack_00000228 + 8);
  local_398[0x4a] = *(long *)(in_stack_00000230 + 8) - 1;
  if (*(long *)(in_stack_00000230 + 8) == 0) {
    local_398[0x4a] = sVar3;
  }
  local_398[0x4b] = *(undefined8 *)(in_stack_00000238 + 8);
  local_398[0x4c] = *in_stack_00000240;
  local_398[0x4d] = *(undefined8 *)(in_stack_00000248 + 8);
  local_398[0x4e] = *in_stack_00000250;
  local_398[0x4f] = *(undefined8 *)(in_stack_00000258 + 8);
  local_398[0x50] = *(undefined8 *)(in_stack_00000260 + 8);
  local_398[0x51] = *(undefined8 *)(in_stack_00000268 + 8);
  local_398[0x52] = *(undefined8 *)(in_stack_00000270 + 8);
  local_398[0x53] = *(undefined8 *)(in_stack_00000278 + 8);
  local_398[0x54] = *(long *)(in_stack_00000280 + 8) - 1;
  if (*(long *)(in_stack_00000280 + 8) == 0) {
    local_398[0x54] = sVar3;
  }
  local_398[0x55] = *(undefined8 *)(in_stack_00000288 + 8);
  local_398[0x56] = *(undefined8 *)(in_stack_00000290 + 8);
  local_398[0x57] = *(undefined8 *)(in_stack_00000298 + 8);
  local_398[0x58] = *(long *)(in_stack_000002a0 + 8) - 1;
  if (*(long *)(in_stack_000002a0 + 8) == 0) {
    local_398[0x58] = sVar3;
  }
  local_398[0x59] = *(undefined8 *)(in_stack_000002a8 + 8);
  local_398[0x5a] = *in_stack_000002b0;
  local_398[0x5b] = *(undefined8 *)(in_stack_000002b8 + 8);
  local_398[0x5c] = *in_stack_000002c0;
  local_398[0x5d] = *(undefined8 *)(in_stack_000002c8 + 8);
  local_398[0x5e] = *(long *)(in_stack_000002d0 + 8) - 1;
  if (*(long *)(in_stack_000002d0 + 8) == 0) {
    local_398[0x5e] = sVar3;
  }
  local_398[0x5f] = *(undefined8 *)(in_stack_000002d8 + 8);
  local_398[0x60] = *(undefined8 *)(in_stack_000002e0 + 8);
  local_398[0x61] = *(undefined8 *)(in_stack_000002e8 + 8);
  local_398[0x62] = *(undefined8 *)(in_stack_000002f0 + 8);
  local_398[99] = *(undefined8 *)(in_stack_000002f8 + 8);
  local_398[100] = *(undefined8 *)(in_stack_00000300 + 8);
  local_398[0x65] = *(undefined8 *)(in_stack_00000308 + 8);
  local_398[0x66] = *(long *)(in_stack_00000310 + 8) - 1;
  if (*(long *)(in_stack_00000310 + 8) == 0) {
    local_398[0x66] = sVar3;
  }
  local_398[0x67] = *(undefined8 *)(in_stack_00000318 + 8);
  local_398[0x68] = *in_stack_00000320;
  local_398[0x69] = *(undefined8 *)(in_stack_00000328 + 8);
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_398 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x350);
  __return_storage_ptr__->size_ = sVar3;
  local_398[0] = 0;
  local_398[1] = 0;
  local_398[2] = *(undefined8 *)(params_1 + 8);
  local_398[3] = *(undefined8 *)(params_2 + 8);
  local_398[4] = *(undefined8 *)(params_3 + 8);
  local_398[5] = *(undefined8 *)(params_4 + 8);
  local_398[6] = *(undefined8 *)(params_5 + 8);
  local_398[7] = *(undefined8 *)(params_6 + 8);
  local_398[8] = *(undefined8 *)(params_7 + 8);
  local_398[9] = *params_8;
  local_398[10] = *(undefined8 *)(params_9 + 8);
  sVar3 = 0;
  local_398[0xb] = 0;
  local_398[0xc] = *(undefined8 *)(params_11 + 8);
  local_398[0xd] = *(undefined8 *)(params_12 + 8);
  local_398[0xe] = *(undefined8 *)(params_13 + 8);
  local_398[0xf] = *(undefined8 *)(params_14 + 8);
  local_398[0x10] = *(undefined8 *)(params_15 + 8);
  local_398[0x11] = *(undefined8 *)(params_16 + 8);
  local_398[0x12] = *(undefined8 *)(params_17 + 8);
  local_398[0x13] = *params_18;
  local_398[0x14] = *(undefined8 *)(params_19 + 8);
  local_398[0x15] = 0;
  local_398[0x16] = *(undefined8 *)(params_21 + 8);
  local_398[0x17] = 0;
  local_398[0x18] = *(undefined8 *)(params_23 + 8);
  local_398[0x19] = *(undefined8 *)(params_24 + 8);
  local_398[0x1a] = *(undefined8 *)(params_25 + 8);
  local_398[0x1b] = *(undefined8 *)(params_26 + 8);
  local_398[0x1c] = *(undefined8 *)(params_27 + 8);
  local_398[0x1d] = *(undefined8 *)(params_28 + 8);
  local_398[0x1e] = *(undefined8 *)(params_29 + 8);
  local_398[0x1f] = 0;
  local_398[0x20] = *(undefined8 *)(params_31 + 8);
  local_398[0x21] = *params_32;
  local_398[0x22] = *(undefined8 *)(params_33 + 8);
  local_398[0x23] = 0;
  local_398[0x24] = *(undefined8 *)(params_35 + 8);
  local_398[0x25] = 0;
  local_398[0x26] = *(undefined8 *)(params_37 + 8);
  local_398[0x27] = *(undefined8 *)(params_38 + 8);
  local_398[0x28] = *(undefined8 *)(params_39 + 8);
  local_398[0x29] = *(undefined8 *)(params_40 + 8);
  local_398[0x2a] = *(undefined8 *)(params_41 + 8);
  local_398[0x2b] = *(undefined8 *)(params_42 + 8);
  local_398[0x2c] = *(undefined8 *)(params_43 + 8);
  local_398[0x2d] = 0;
  local_398[0x2e] = *(undefined8 *)(params_45 + 8);
  local_398[0x2f] = *params_46;
  local_398[0x30] = *(undefined8 *)(params_47 + 8);
  local_398[0x31] = 0;
  local_398[0x32] = 0;
  local_398[0x33] = *(undefined8 *)(params_50 + 8);
  local_398[0x34] = *(undefined8 *)(params_51 + 8);
  local_398[0x35] = *(undefined8 *)(params_52 + 8);
  local_398[0x36] = *(undefined8 *)(params_53 + 8);
  local_398[0x37] = *(undefined8 *)(params_54 + 8);
  local_398[0x38] = 0;
  local_398[0x39] = *(undefined8 *)(params_56 + 8);
  local_398[0x3a] = *(undefined8 *)(params_57 + 8);
  local_398[0x3b] = *(undefined8 *)(params_58 + 8);
  local_398[0x3c] = 0;
  local_398[0x3d] = *(undefined8 *)(params_60 + 8);
  local_398[0x3e] = *params_61;
  local_398[0x3f] = *(undefined8 *)(params_62 + 8);
  local_398[0x40] = 0;
  local_398[0x41] = *(undefined8 *)(params_64 + 8);
  local_398[0x42] = *(undefined8 *)(params_65 + 8);
  local_398[0x43] = *(undefined8 *)(in_stack_000001f8 + 8);
  local_398[0x44] = *(undefined8 *)(in_stack_00000200 + 8);
  local_398[0x45] = *(undefined8 *)(in_stack_00000208 + 8);
  local_398[0x46] = 0;
  local_398[0x47] = *(undefined8 *)(in_stack_00000218 + 8);
  local_398[0x48] = *(undefined8 *)(in_stack_00000220 + 8);
  local_398[0x49] = *(undefined8 *)(in_stack_00000228 + 8);
  local_398[0x4a] = 0;
  local_398[0x4b] = *(undefined8 *)(in_stack_00000238 + 8);
  local_398[0x4c] = *in_stack_00000240;
  local_398[0x4d] = *(undefined8 *)(in_stack_00000248 + 8);
  local_398[0x4e] = 0;
  local_398[0x4f] = *(undefined8 *)(in_stack_00000258 + 8);
  local_398[0x50] = *(undefined8 *)(in_stack_00000260 + 8);
  local_398[0x51] = *(undefined8 *)(in_stack_00000268 + 8);
  local_398[0x52] = *(undefined8 *)(in_stack_00000270 + 8);
  local_398[0x53] = *(undefined8 *)(in_stack_00000278 + 8);
  local_398[0x54] = 0;
  local_398[0x55] = *(undefined8 *)(in_stack_00000288 + 8);
  local_398[0x56] = *(undefined8 *)(in_stack_00000290 + 8);
  local_398[0x57] = *(undefined8 *)(in_stack_00000298 + 8);
  local_398[0x58] = 0;
  local_398[0x59] = *(undefined8 *)(in_stack_000002a8 + 8);
  local_398[0x5a] = *in_stack_000002b0;
  local_398[0x5b] = *(undefined8 *)(in_stack_000002b8 + 8);
  local_398[0x5c] = 0;
  local_398[0x5d] = *(undefined8 *)(in_stack_000002c8 + 8);
  local_398[0x5e] = 0;
  local_398[0x5f] = *(undefined8 *)(in_stack_000002d8 + 8);
  local_398[0x60] = *(undefined8 *)(in_stack_000002e0 + 8);
  local_398[0x61] = *(undefined8 *)(in_stack_000002e8 + 8);
  local_398[0x62] = *(undefined8 *)(in_stack_000002f0 + 8);
  local_398[99] = *(undefined8 *)(in_stack_000002f8 + 8);
  local_398[100] = *(undefined8 *)(in_stack_00000300 + 8);
  local_398[0x65] = *(undefined8 *)(in_stack_00000308 + 8);
  local_398[0x66] = 0;
  local_398[0x67] = *(undefined8 *)(in_stack_00000318 + 8);
  local_398[0x68] = *in_stack_00000320;
  local_398[0x69] = *(undefined8 *)(in_stack_00000328 + 8);
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_398 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x350);
  local_40 = this;
  local_38 = params;
  heapString(&local_3b8,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_3b8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_3b8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_3b8.content.disposer;
  local_398[0] = 1;
  local_398[1] = 1;
  local_398[2] = 0;
  local_398[3] = 0;
  local_398[4] = 0;
  local_398[5] = 0;
  local_398[6] = 0;
  local_398[7] = 0;
  local_398[8] = 0;
  local_398[9] = 0;
  sVar3 = 0;
  local_398[10] = 0;
  local_398[0xb] = 1;
  local_398[0xc] = 0;
  local_398[0xd] = 0;
  local_398[0xe] = 0;
  local_398[0xf] = 0;
  local_398[0x10] = 0;
  local_398[0x11] = 0;
  local_398[0x12] = 0;
  local_398[0x13] = 0;
  local_398[0x14] = 0;
  local_398[0x15] = 1;
  local_398[0x16] = 0;
  local_398[0x17] = 1;
  local_398[0x18] = 0;
  local_398[0x19] = 0;
  local_398[0x1a] = 0;
  local_398[0x1b] = 0;
  local_398[0x1c] = 0;
  local_398[0x1d] = 0;
  local_398[0x1e] = 0;
  local_398[0x1f] = 1;
  local_398[0x22] = 0;
  local_398[0x20] = 0;
  local_398[0x21] = 0;
  local_398[0x23] = 1;
  local_398[0x24] = 0;
  local_398[0x25] = 1;
  local_398[0x26] = 0;
  local_398[0x27] = 0;
  local_398[0x28] = 0;
  local_398[0x29] = 0;
  local_398[0x2a] = 0;
  local_398[0x2b] = 0;
  local_398[0x2c] = 0;
  local_398[0x2d] = 1;
  local_398[0x30] = 0;
  local_398[0x2e] = 0;
  local_398[0x2f] = 0;
  local_398[0x31] = 1;
  local_398[0x32] = 1;
  local_398[0x33] = 0;
  local_398[0x34] = 0;
  local_398[0x35] = 0;
  local_398[0x36] = 0;
  local_398[0x37] = 0;
  local_398[0x38] = 1;
  local_398[0x3b] = 0;
  local_398[0x39] = 0;
  local_398[0x3a] = 0;
  local_398[0x3c] = 1;
  local_398[0x3f] = 0;
  local_398[0x3d] = 0;
  local_398[0x3e] = 0;
  local_398[0x40] = 1;
  local_398[0x45] = 0;
  local_398[0x43] = 0;
  local_398[0x44] = 0;
  local_398[0x41] = 0;
  local_398[0x42] = 0;
  local_398[0x46] = 1;
  local_398[0x49] = 0;
  local_398[0x47] = 0;
  local_398[0x48] = 0;
  local_398[0x4a] = 1;
  local_398[0x4d] = 0;
  local_398[0x4b] = 0;
  local_398[0x4c] = 0;
  local_398[0x4e] = 1;
  local_398[0x53] = 0;
  local_398[0x51] = 0;
  local_398[0x52] = 0;
  local_398[0x4f] = 0;
  local_398[0x50] = 0;
  local_398[0x54] = 1;
  local_398[0x57] = 0;
  local_398[0x55] = 0;
  local_398[0x56] = 0;
  local_398[0x58] = 1;
  local_398[0x5b] = 0;
  local_398[0x59] = 0;
  local_398[0x5a] = 0;
  local_398[0x5c] = 1;
  local_398[0x5d] = 0;
  local_398[0x5e] = 1;
  local_398[0x65] = 0;
  local_398[99] = 0;
  local_398[100] = 0;
  local_398[0x61] = 0;
  local_398[0x62] = 0;
  local_398[0x5f] = 0;
  local_398[0x60] = 0;
  local_398[0x66] = 1;
  local_398[0x69] = 0;
  local_398[0x67] = 0;
  local_398[0x68] = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_398 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x350);
  local_3b8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_3b8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_3b8.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_3b8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_3b8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_3b8.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_con___char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,local_40,local_38,params_1,params_2,params_3,params_4,
             params_5,params_6,params_7,params_8,params_9,params_10,params_11,params_12,params_13,
             params_14,params_15,params_16,params_17,params_18,params_19,params_20,params_21,
             params_22,params_23,params_24,params_25,params_26,params_27,params_28,params_29,
             params_30,params_31,params_32,params_33,params_34,params_35,params_36,params_37,
             params_38,params_39,params_40,params_41,params_42,params_43,params_44,params_45,
             params_46,params_47,params_48,params_49,params_50,params_51,params_52,params_53,
             params_54,params_55,params_56,params_57,params_58,params_59,params_60,params_61,
             params_62,params_63);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}